

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

string * ip2string_abi_cxx11_(string *__return_storage_ptr__,uint32_t ip)

{
  ostream *poVar1;
  ostringstream out;
  char local_191;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  local_191 = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_191,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_191 = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_191,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_191 = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_191,1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ip2string(const uint32_t ip)
{
  std::ostringstream out;

  out << ((ip>>24)&0xff) << '.' << ((ip>>16)&0xff) << '.'
      << ((ip>>8)&0xff) << '.' << (ip&0xff);

  return out.str();
}